

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
MlmWrap::getCurConnectedClients_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,MlmWrap *this,mlm_client_t *temp)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  zmsg_t *msg;
  string curItem;
  zmsg_t *local_60;
  value_type local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = __return_storage_ptr__;
  cVar3 = mlm_client_connected(temp);
  if (cVar3 == '\0') {
    iVar4 = -5;
    paVar1 = &local_58.field_2;
    while( true ) {
      pcVar2 = (this->state->endpoint)._M_dataplus._M_p;
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + (this->state->endpoint)._M_string_length);
      iVar5 = mlm_client_connect(temp,local_58._M_dataplus._M_p,1000,"temp");
      if (-1 < iVar5) break;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      iVar4 = iVar4 + 1;
      if (iVar4 == 0) {
        return local_38;
      }
      zclock_sleep(100);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (iVar5 != 0) {
      return local_38;
    }
  }
  local_60 = zmsg_new();
  mlm_client_sendtox(temp,"Broker","CLIENTLIST","s",0);
  zmsg_destroy(&local_60);
  local_60 = (zmsg_t *)mlm_client_recv(temp);
  pcVar6 = zmsg_popstr(local_60);
  free(pcVar6);
  pcVar6 = zmsg_popstr(local_60);
  free(pcVar6);
  pcVar6 = zmsg_popstr(local_60);
  if (pcVar6 != (char *)0x0) {
    do {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      sVar7 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar6,pcVar6 + sVar7);
      iVar4 = strcmp(pcVar6,"Broker");
      if ((iVar4 != 0) && (iVar4 = strcmp(pcVar6,"temp"), iVar4 != 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_38,&local_58);
      }
      free(pcVar6);
      pcVar6 = zmsg_popstr(local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    } while (pcVar6 != (char *)0x0);
  }
  zmsg_destroy(&local_60);
  return local_38;
}

Assistant:

std::vector<std::string> MlmWrap::getCurConnectedClients(mlm_client_t *temp) {

    std::vector<std::string> cList; //client list to return
    int rc = 0;

    //put this next part in while loop w/ sleep to constantly try to check until it does
    if(!mlm_client_connected(temp)){
        int tries = 5;
        while((rc = mlm_client_connect(temp, state->getEndpoint().c_str(), 1000, TEMP_NETWORK_ID)) < 0 && --tries){
            zclock_sleep(100);
        }
    }

    if (rc == 0) {
        zmsg_t* msg = zmsg_new();
        rc = mlm_client_sendtox(temp, BROKER_NETWORK_ID, clientlist, "s", NULL);
        zmsg_destroy(&msg);

        msg = mlm_client_recv(temp);
        char *listItem = zmsg_popstr(msg); //pull first string off the msg, it's 'm'
        freen(listItem);
        listItem = zmsg_popstr(msg); //pull second string off the msg, it's 'CLIENTLIST'
        freen(listItem);
        listItem = zmsg_popstr(msg);
        while (listItem != NULL) {
            std::string curItem = listItem;
            if(!(streq(listItem, BROKER_NETWORK_ID) || streq(listItem, TEMP_NETWORK_ID))){
                cList.push_back(curItem);
            }
            freen(listItem);
            listItem = zmsg_popstr(msg);
        }
        zmsg_destroy(&msg);
    }
    else{

    }
    return(cList);
}